

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O1

void __thiscall
ktx::ValidationContext::validateKTXglFormat(ValidationContext *this,uint8_t *data,uint32_t size)

{
  uint uVar1;
  _khr_df_model_e _Var2;
  char *__s;
  size_t sVar3;
  ktxSupercmpScheme scheme;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  Value value;
  uint32_t local_6c;
  string local_68;
  undefined8 local_44;
  uint local_3c;
  long local_38 [2];
  
  this->foundKTXglFormat = true;
  uVar1 = (this->header).vkFormat;
  local_6c = size;
  if (uVar1 != 0) {
    toString_abi_cxx11_(&local_68,(ktx *)(ulong)uVar1,size);
    error<std::__cxx11::string>(this,&Metadata::KTXglFormatWithVkFormat,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_6c == 0xc) {
    local_44 = 0;
    local_3c = 0;
    memcpy(&local_44,data,0xc);
    if (local_3c != 0 || local_44._4_4_ != 0) {
      uVar1 = (this->header).supercompressionScheme;
      if (uVar1 == 1) {
        toString_abi_cxx11_(&local_68,(ktx *)(ulong)uVar1,scheme);
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_44 + 4),&local_3c,&local_68);
      }
      else {
        if ((this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>._M_payload.
            super__Optional_payload_base<_khr_df_model_e>._M_engaged != true) {
          return;
        }
        _Var2 = (this->parsedColorModel).super__Optional_base<_khr_df_model_e,_true,_true>.
                _M_payload.super__Optional_payload_base<_khr_df_model_e>._M_payload._M_value;
        if ((long)(int)_Var2 < 0x80) {
          return;
        }
        __s = (char *)dfdToStringColorModel(_Var2);
        if (__s == (char *)0x0) {
          fmt.size_ = 2;
          fmt.data_ = (char *)0xa;
          args.field_1.args_ = in_R9.args_;
          args.desc_ = (unsigned_long_long)local_38;
          local_38[0] = (long)(int)_Var2;
          ::fmt::v10::vformat_abi_cxx11_(&local_68,(v10 *)"(0x{:02X})",fmt,args);
        }
        else {
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          sVar3 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,__s,__s + sVar3);
        }
        error<unsigned_int&,unsigned_int&,std::__cxx11::string>
                  (this,&Metadata::KTXglFormatInvalidValueForCompressed,
                   (uint *)((long)&local_44 + 4),&local_3c,&local_68);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_68._M_dataplus._M_p != &local_68.field_2) {
        operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
      }
    }
  }
  else {
    error<unsigned_int&>(this,&Metadata::KTXglFormatInvalidSize,&local_6c);
  }
  return;
}

Assistant:

void ValidationContext::validateKTXglFormat(const uint8_t* data, uint32_t size) {
    foundKTXglFormat = true;

    if (header.vkFormat != VK_FORMAT_UNDEFINED)
        error(Metadata::KTXglFormatWithVkFormat, toString(VkFormat(header.vkFormat)));

    if (size != 12) {
        error(Metadata::KTXglFormatInvalidSize, size);
        return;
    }

    struct Value {
        uint32_t glInternalformat = 0;
        uint32_t glFormat = 0;
        uint32_t glType = 0;
    };

    Value value{};
    std::memcpy(&value, data, size);

    if (value.glFormat != 0 || value.glType != 0) {
        if (isSupercompressionBlockCompressed(ktxSupercmpScheme(header.supercompressionScheme)))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(ktxSupercmpScheme(header.supercompressionScheme)));

        else if (parsedColorModel && isColorModelBlockCompressed(*parsedColorModel))
            error(Metadata::KTXglFormatInvalidValueForCompressed, value.glFormat, value.glType, toString(*parsedColorModel));
    }
}